

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBackwardCompatibility.cpp
# Opt level: O0

void anon_unknown.dwarf_2d24c::generateScanlinePlanarImage(char *fn)

{
  int iVar1;
  float *pfVar2;
  half *phVar3;
  char *pcVar4;
  undefined4 *puVar5;
  char *in_RDI;
  OutputFile file;
  FrameBuffer fb;
  Header header;
  Box2i dod;
  int j;
  int i;
  Array2D<Imath_3_2::half> ph;
  Array2D<float> pf;
  Header *in_stack_000003e0;
  float in_stack_fffffffffffffcfc;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffd04;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffffd10;
  long in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  undefined1 local_228 [72];
  Slice local_1e0 [56];
  Slice local_1a8 [56];
  Slice local_170 [56];
  char local_138 [48];
  Channel local_108 [16];
  Channel local_f8 [16];
  Channel local_e8 [16];
  Channel local_d8 [16];
  Vec2<float> local_c8;
  Header local_c0 [60];
  Vec2<float> local_84;
  Vec2<int> local_7c;
  Vec2<float> local_74;
  Vec2<int> local_6c;
  Box local_64 [18];
  uint16_t local_52;
  int local_50;
  int local_4c;
  Array2D<Imath_3_2::half> local_48;
  Array2D<float> local_20;
  char *local_8;
  
  local_8 = in_RDI;
  Imf_3_2::Array2D<float>::Array2D
            ((Array2D<float> *)in_stack_fffffffffffffd10,
             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
             CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  Imf_3_2::Array2D<float>::resizeErase
            ((Array2D<float> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd18,(long)in_stack_fffffffffffffd10);
  Imf_3_2::Array2D<Imath_3_2::half>::Array2D
            (in_stack_fffffffffffffd10,CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08)
             ,CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  Imf_3_2::Array2D<Imath_3_2::half>::resizeErase
            ((Array2D<Imath_3_2::half> *)
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),in_stack_fffffffffffffd18
             ,(long)in_stack_fffffffffffffd10);
  for (local_4c = 0; local_4c < 0xc5; local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < 0xd9; local_50 = local_50 + 1) {
      iVar1 = local_4c * 0xd9 + local_50;
      pfVar2 = Imf_3_2::Array2D<float>::operator[](&local_20,(long)local_4c);
      pfVar2[local_50] = (float)iVar1 / 42749.0;
      Imf_3_2::Array2D<float>::operator[](&local_20,(long)local_4c);
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 in_stack_fffffffffffffcfc);
      phVar3 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_48,(long)local_4c);
      phVar3[local_50]._h = local_52;
    }
  }
  Imath_3_2::Vec2<float>::Vec2(&local_74,20.0);
  Imath_3_2::Vec2<int>::Vec2<float>(&local_6c,&local_74);
  Imath_3_2::Vec2<float>::Vec2(&local_84,197.0,174.0);
  Imath_3_2::Vec2<int>::Vec2<float>(&local_7c,&local_84);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffd10,
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  Imath_3_2::Vec2<float>::Vec2(&local_c8,0.0,0.0);
  Imf_3_2::Header::Header
            (local_c0,0xd9,0xc5,local_64,1.0,(Vec2 *)&local_c8,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pcVar4 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel(local_d8,FLOAT,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar4,(Channel *)0x250539);
  pcVar4 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel(local_e8,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar4,(Channel *)0x243823);
  pcVar4 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel(local_f8,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar4,(Channel *)0x243836);
  pcVar4 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel(local_108,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar4,(Channel *)0x243849);
  puVar5 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar5 = 0;
  addUserAttributesToHeader(in_stack_000003e0);
  Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x13e316);
  pfVar2 = Imf_3_2::Array2D<float>::operator[](&local_20,0);
  Imf_3_2::Slice::Slice(local_170,FLOAT,(char *)pfVar2,4,0x364,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert(local_138,(Slice *)0x250539);
  phVar3 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_48,0);
  Imf_3_2::Slice::Slice(local_1a8,HALF,(char *)phVar3,2,0x1b2,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert(local_138,(Slice *)0x243823);
  phVar3 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_48,0);
  Imf_3_2::Slice::Slice(local_1e0,HALF,(char *)phVar3,2,0x1b2,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert(local_138,(Slice *)0x243836);
  phVar3 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_48,0);
  uVar6 = 0;
  Imf_3_2::Slice::Slice((Slice *)(local_228 + 0x10),HALF,(char *)phVar3,2,0x1b2,1,1,0.0,false,false)
  ;
  Imf_3_2::FrameBuffer::insert(local_138,(Slice *)0x243849);
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::OutputFile::OutputFile((OutputFile *)local_228,local_8,local_c0,iVar1);
  Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)local_228);
  Imf_3_2::OutputFile::writePixels((int)local_228);
  Imf_3_2::OutputFile::~OutputFile((OutputFile *)local_228);
  Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x13e582);
  Imf_3_2::Header::~Header(local_c0);
  Imf_3_2::Array2D<Imath_3_2::half>::~Array2D
            ((Array2D<Imath_3_2::half> *)CONCAT44(in_stack_fffffffffffffd04,uVar6));
  Imf_3_2::Array2D<float>::~Array2D((Array2D<float> *)CONCAT44(in_stack_fffffffffffffd04,uVar6));
  return;
}

Assistant:

void
generateScanlinePlanarImage (const char* fn)
{
    // generate a v 1.7 image and check against ground truth on disk
    Array2D<float> pf (H, W);
    pf.resizeErase (H, W);
    Array2D<half> ph (H, W);
    ph.resizeErase (H, W);

    for (int i = 0; i < H; i++)
    {
        for (int j = 0; j < W; j++)
        {
            pf[i][j] = (float) ((i * W + j) / (float (W * H)));
            ph[i][j] = (half) (pf[i][j]);
        }
    }

    IMATH_NAMESPACE::Box2i dod (
        IMATH_NAMESPACE::V2f (20), IMATH_NAMESPACE::V2f (W - 20, H - 23));
    OPENEXR_IMF_NAMESPACE::Header header = Header (W, H, dod);
    header.channels ().insert ("Z", Channel (IMF::FLOAT));
    header.channels ().insert ("R", Channel (IMF::HALF));
    header.channels ().insert ("G", Channel (IMF::HALF));
    header.channels ().insert ("B", Channel (IMF::HALF));
    header.compression () = NO_COMPRESSION;
    addUserAttributesToHeader (header);

    FrameBuffer fb;

    fb.insert (
        "Z",
        Slice (
            IMF::FLOAT,
            (char*) &pf[0][0],
            sizeof (pf[0][0]),
            sizeof (pf[0][0]) * W));

    fb.insert (
        "R",
        Slice (
            IMF::HALF,
            (char*) &ph[0][0],
            sizeof (ph[0][0]),
            sizeof (ph[0][0]) * W));
    fb.insert (
        "G",
        Slice (
            IMF::HALF,
            (char*) &ph[0][0],
            sizeof (ph[0][0]),
            sizeof (ph[0][0]) * W));
    fb.insert (
        "B",
        Slice (
            IMF::HALF,
            (char*) &ph[0][0],
            sizeof (ph[0][0]),
            sizeof (ph[0][0]) * W));

    OutputFile file (fn, header);
    file.setFrameBuffer (fb);
    file.writePixels (dod.max.y - dod.min.y + 1);
}